

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

void __thiscall soul::Value::Value(Value *this,Type *t)

{
  Category CVar1;
  bool bVar2;
  bool bVar3;
  BoundedIntSize BVar4;
  uint64_t uVar5;
  
  CVar1 = t->arrayElementCategory;
  bVar2 = t->isRef;
  bVar3 = t->isConstant;
  (this->type).category = t->category;
  (this->type).arrayElementCategory = CVar1;
  (this->type).isRef = bVar2;
  (this->type).isConstant = bVar3;
  (this->type).primitiveType.type = (t->primitiveType).type;
  BVar4 = t->arrayElementBoundingSize;
  (this->type).boundingSize = t->boundingSize;
  (this->type).arrayElementBoundingSize = BVar4;
  (this->type).structure.object = (t->structure).object;
  (t->structure).object = (Structure *)0x0;
  uVar5 = Type::getPackedSizeInBytes(&this->type);
  (this->allocatedData).allocatedSize = uVar5;
  (this->allocatedData).allocatedData.items = (uchar *)(this->allocatedData).allocatedData.space;
  (this->allocatedData).allocatedData.numActive = 0;
  (this->allocatedData).allocatedData.numAllocated = 8;
  return;
}

Assistant:

Value::Value (Type t)  : type (std::move (t)), allocatedData ((size_t) type.getPackedSizeInBytes()) {}